

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaAllocator_T::AllocateDedicatedMemoryPage
          (VmaAllocator_T *this,VmaPool pool,VkDeviceSize size,VmaSuballocationType suballocType,
          uint32_t memTypeIndex,VkMemoryAllocateInfo *allocInfo,bool map,bool isUserDataString,
          bool isMappingAllowed,void *pUserData,VmaAllocation *pAllocation)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  uint uVar3;
  VkResult VVar4;
  VmaAllocation pVVar5;
  bool local_41;
  VkDeviceMemory local_40;
  void *local_38;
  
  local_41 = isMappingAllowed;
  local_40 = (VkDeviceMemory)0x0;
  VVar4 = AllocateVulkanMemory(this,allocInfo,&local_40);
  if (VK_ERROR_OUT_OF_HOST_MEMORY < VVar4) {
    local_38 = (void *)0x0;
    if ((map) && (VVar4 = (*(this->m_VulkanFunctions).vkMapMemory)
                                    (this->m_hDevice,local_40,0,0xffffffffffffffff,0,&local_38),
                 VVar4 < VK_SUCCESS)) {
      FreeVulkanMemory(this,memTypeIndex,size,local_40);
    }
    else {
      pVVar5 = VmaAllocationObjectAllocator::Allocate<bool&>
                         (&this->m_AllocationObjectAllocator,&local_41);
      *pAllocation = pVVar5;
      pVVar5->m_Type = '\x02';
      pVVar5->m_Alignment = 0;
      pVVar5->m_Size = size;
      pVVar5->m_MemoryTypeIndex = memTypeIndex;
      pVVar5->m_SuballocationType = (uint8_t)suballocType;
      if (local_38 != (void *)0x0) {
        pVVar5->m_Flags = pVVar5->m_Flags | 1;
      }
      (pVVar5->field_0).m_DedicatedAllocation.m_hParentPool = pool;
      (pVVar5->field_0).m_DedicatedAllocation.m_hMemory = local_40;
      (pVVar5->field_0).m_DedicatedAllocation.m_pMappedData = local_38;
      (pVVar5->field_0).m_DedicatedAllocation.m_Prev = (VmaAllocation_T *)0x0;
      (pVVar5->field_0).m_DedicatedAllocation.m_Next = (VmaAllocation_T *)0x0;
      if (isUserDataString) {
        VmaAllocation_T::SetName(*pAllocation,this,(char *)pUserData);
      }
      else {
        (*pAllocation)->m_pUserData = pUserData;
      }
      uVar3 = (this->m_MemProps).memoryTypes[memTypeIndex].heapIndex;
      LOCK();
      paVar2 = (this->m_Budget).m_AllocationBytes + uVar3;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + size;
      UNLOCK();
      LOCK();
      paVar1 = (this->m_Budget).m_AllocationCount + uVar3;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      LOCK();
      paVar1 = &(this->m_Budget).m_OperationsSinceBudgetFetch;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      VVar4 = VK_SUCCESS;
    }
  }
  return VVar4;
}

Assistant:

VkResult VmaAllocator_T::AllocateDedicatedMemoryPage(
    VmaPool pool,
    VkDeviceSize size,
    VmaSuballocationType suballocType,
    uint32_t memTypeIndex,
    const VkMemoryAllocateInfo& allocInfo,
    bool map,
    bool isUserDataString,
    bool isMappingAllowed,
    void* pUserData,
    VmaAllocation* pAllocation)
{
    VkDeviceMemory hMemory = VK_NULL_HANDLE;
    VkResult res = AllocateVulkanMemory(&allocInfo, &hMemory);
    if(res < 0)
    {
        VMA_DEBUG_LOG("    vkAllocateMemory FAILED");
        return res;
    }

    void* pMappedData = VMA_NULL;
    if(map)
    {
        res = (*m_VulkanFunctions.vkMapMemory)(
            m_hDevice,
            hMemory,
            0,
            VK_WHOLE_SIZE,
            0,
            &pMappedData);
        if(res < 0)
        {
            VMA_DEBUG_LOG("    vkMapMemory FAILED");
            FreeVulkanMemory(memTypeIndex, size, hMemory);
            return res;
        }
    }

    *pAllocation = m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    (*pAllocation)->InitDedicatedAllocation(pool, memTypeIndex, hMemory, suballocType, pMappedData, size);
    if (isUserDataString)
        (*pAllocation)->SetName(this, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(this, pUserData);
    m_Budget.AddAllocation(MemoryTypeIndexToHeapIndex(memTypeIndex), size);
    if(VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }

    return VK_SUCCESS;
}